

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# token.c
# Opt level: O0

void wp_token_consume_hexadecimal_digits(w_tokenizer *tokenizer)

{
  bool bVar1;
  w_tokenizer *tokenizer_local;
  
  if (tokenizer == (w_tokenizer *)0x0) {
    w_handle_failed_assertion
              ("tokenizer != NULL","wp_token_consume_hexadecimal_digits",
               "/workspace/llm4binary/github/license_all_cmakelists_25/christophercrouzet[P]uuki/src/lang/token.c"
               ,0xcd);
  }
  if (tokenizer->it == (char *)0x0) {
    w_handle_failed_assertion
              ("tokenizer->it != NULL","wp_token_consume_hexadecimal_digits",
               "/workspace/llm4binary/github/license_all_cmakelists_25/christophercrouzet[P]uuki/src/lang/token.c"
               ,0xce);
  }
  while( true ) {
    if (((*tokenizer->it < '0') || (bVar1 = true, '9' < *tokenizer->it)) &&
       (bVar1 = false, '@' < *tokenizer->it)) {
      bVar1 = *tokenizer->it < 'G';
    }
    if (!bVar1) break;
    wp_token_advance_iter(tokenizer);
  }
  return;
}

Assistant:

static void
wp_token_consume_hexadecimal_digits(
    struct w_tokenizer *tokenizer
)
{
    W_ASSERT(tokenizer != NULL);
    W_ASSERT(tokenizer->it != NULL);

    while (
        (*tokenizer->it >= '0' && *tokenizer->it <= '9')
        || (*tokenizer->it >= 'A' && *tokenizer->it <= 'F')
    )
    {
        wp_token_advance_iter(tokenizer);
    }
}